

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::write_access_chain_array
          (CompilerHLSL *this,SPIRAccessChain *chain,uint32_t value,
          SmallVector<unsigned_int,_8UL> *composite_chain)

{
  string *this_00;
  undefined8 type_00;
  bool bVar1;
  uint32_t uVar2;
  size_t sVar3;
  SPIRType *pSVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_5;
  ID local_300;
  uint local_2fc;
  undefined1 local_2f8 [8];
  SmallVector<unsigned_int,_8UL> subcomposite_chain;
  undefined1 local_2a0 [8];
  SPIRAccessChain subchain;
  ID local_1c8;
  bool local_1c1;
  undefined1 local_1c0 [8];
  SPIRType int_type;
  uint32_t int_type_id;
  uint32_t local_5c;
  undefined1 local_58 [4];
  uint32_t id;
  string ident;
  SPIRType *type;
  SPIRType *ptype;
  SmallVector<unsigned_int,_8UL> *composite_chain_local;
  uint32_t value_local;
  SPIRAccessChain *chain_local;
  CompilerHLSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).field_0xc);
  for (type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
      (type->pointer & 1U) != 0;
      type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type->basetype)) {
  }
  ident.field_2._8_8_ = type;
  get_unique_identifier_abi_cxx11_((string *)local_58,this);
  local_5c = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,2);
  int_type.member_name_cache._M_h._M_single_bucket._0_4_ = local_5c + 1;
  SPIRType::SPIRType((SPIRType *)local_1c0,OpTypeInt);
  int_type.super_IVariant.self.id = 7;
  int_type.super_IVariant._12_4_ = 0x20;
  Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
            ((Compiler *)this,(uint32_t)int_type.member_name_cache._M_h._M_single_bucket,
             (SPIRType *)local_1c0);
  local_1c1 = true;
  Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string&,unsigned_int&,bool>
            ((Compiler *)this,local_5c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (uint *)&int_type.member_name_cache._M_h._M_single_bucket,&local_1c1);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_1c8,local_5c);
  Compiler::set_name((Compiler *)this,local_1c8,(string *)local_58);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::insert(&(this->super_CompilerGLSL).super_Compiler.suppressed_usage_tracking,&local_5c);
  CompilerGLSL::statement<char_const(&)[9]>(&this->super_CompilerGLSL,(char (*) [9])"[unroll]");
  type_00 = ident.field_2._8_8_;
  sVar3 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(ident.field_2._8_8_ + 0x20));
  CompilerGLSL::to_array_size_abi_cxx11_
            ((string *)(subchain.implied_read_expressions.stack_storage.aligned_char + 0x18),
             &this->super_CompilerGLSL,(SPIRType *)type_00,(int)sVar3 - 1);
  ts_5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (subchain.implied_read_expressions.stack_storage.aligned_char + 0x18);
  CompilerGLSL::
  statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
            (&this->super_CompilerGLSL,(char (*) [10])"for (int ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (char (*) [7])" = 0; ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (char (*) [4])" < ",ts_5,(char (*) [3])0x663378,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (char (*) [4])0x68283d);
  ::std::__cxx11::string::~string
            ((string *)(subchain.implied_read_expressions.stack_storage.aligned_char + 0x18));
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  SPIRAccessChain::SPIRAccessChain((SPIRAccessChain *)local_2a0,chain);
  join<std::__cxx11::string&,char_const(&)[4],unsigned_int_const&,char_const(&)[4],std::__cxx11::string_const&>
            ((string *)(subcomposite_chain.stack_storage.aligned_char + 0x18),
             (spirv_cross *)local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x672d14,
             (char (*) [4])&chain->array_stride,(uint *)0x66a9b3,(char (*) [4])&chain->dynamic_index
             ,ts_5);
  this_00 = (string *)(subcomposite_chain.stack_storage.aligned_char + 0x18);
  ::std::__cxx11::string::operator=((string *)(subchain.base.field_2._M_local_buf + 8),this_00);
  ::std::__cxx11::string::~string(this_00);
  subchain.super_IVariant._vptr_IVariant._4_4_ = *(undefined4 *)(ident.field_2._8_8_ + 0x114);
  SmallVector<unsigned_int,_8UL>::SmallVector
            ((SmallVector<unsigned_int,_8UL> *)local_2f8,composite_chain);
  local_2fc = local_5c | 0x80000000;
  SmallVector<unsigned_int,_8UL>::push_back((SmallVector<unsigned_int,_8UL> *)local_2f8,&local_2fc);
  uVar2 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)((long)&subchain.super_IVariant._vptr_IVariant + 4));
  pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  bVar1 = VectorView<unsigned_int>::empty(&(pSVar4->array).super_VectorView<unsigned_int>);
  if (!bVar1) {
    TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)1>
              (&local_300,
               (TypedID<(spirv_cross::Types)1> *)((long)&subchain.super_IVariant._vptr_IVariant + 4)
              );
    subchain.loaded_from.id = Compiler::get_decoration((Compiler *)this,local_300,ArrayStride);
  }
  write_access_chain(this,(SPIRAccessChain *)local_2a0,value,
                     (SmallVector<unsigned_int,_8UL> *)local_2f8);
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)local_2f8);
  SPIRAccessChain::~SPIRAccessChain((SPIRAccessChain *)local_2a0);
  SPIRType::~SPIRType((SPIRType *)local_1c0);
  ::std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void CompilerHLSL::write_access_chain_array(const SPIRAccessChain &chain, uint32_t value,
                                            const SmallVector<uint32_t> &composite_chain)
{
	auto *ptype = &get<SPIRType>(chain.basetype);
	while (ptype->pointer)
	{
		ptype = &get<SPIRType>(ptype->basetype);
	}
	auto &type = *ptype;

	// Need to use a reserved identifier here since it might shadow an identifier in the access chain input or other loops.
	auto ident = get_unique_identifier();

	uint32_t id = ir.increase_bound_by(2);
	uint32_t int_type_id = id + 1;
	SPIRType int_type { OpTypeInt };
	int_type.basetype = SPIRType::Int;
	int_type.width = 32;
	set<SPIRType>(int_type_id, int_type);
	set<SPIRExpression>(id, ident, int_type_id, true);
	set_name(id, ident);
	suppressed_usage_tracking.insert(id);

	statement("[unroll]");
	statement("for (int ", ident, " = 0; ", ident, " < ", to_array_size(type, uint32_t(type.array.size() - 1)), "; ",
	          ident, "++)");
	begin_scope();
	auto subchain = chain;
	subchain.dynamic_index = join(ident, " * ", chain.array_stride, " + ", chain.dynamic_index);
	subchain.basetype = type.parent_type;

	// Forcefully allow us to use an ID here by setting MSB.
	auto subcomposite_chain = composite_chain;
	subcomposite_chain.push_back(0x80000000u | id);

	if (!get<SPIRType>(subchain.basetype).array.empty())
		subchain.array_stride = get_decoration(subchain.basetype, DecorationArrayStride);

	write_access_chain(subchain, value, subcomposite_chain);
	end_scope();
}